

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O0

void __thiscall
OpenMD::AngleR::AngleR
          (AngleR *this,SimInfo *info,string *filename,string *sele1,RealType len,int nrbins)

{
  undefined1 uVar1;
  ostream *this_00;
  StaticAnalyser *this_01;
  string *psVar2;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined8 in_XMM0_Qa;
  string paramString;
  stringstream params;
  string *in_stack_fffffffffffffd18;
  StaticAnalyser *in_stack_fffffffffffffd20;
  SimInfo *in_stack_fffffffffffffd28;
  StaticAnalyser *in_stack_fffffffffffffd30;
  undefined8 *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  allocator<char> *__a;
  SelectionEvaluator *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  SelectionEvaluator *this_04;
  string local_268 [32];
  stringstream local_248 [16];
  ostream local_238 [80];
  SimInfo *in_stack_fffffffffffffe18;
  SelectionEvaluator *in_stack_fffffffffffffe20;
  string local_c0 [32];
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [64];
  SimInfo *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(string *)in_stack_fffffffffffffd20
             ,(uint)((ulong)in_stack_fffffffffffffd18 >> 0x20));
  *in_RDI = &PTR__AngleR_0055e748;
  *(undefined1 *)(in_RDI + 0x1a) = 1;
  *(undefined1 *)((long)in_RDI + 0xd1) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 0x1f));
  SelectionManager::SelectionManager
            ((SelectionManager *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  this_04 = (SelectionEvaluator *)(in_RDI + 0x3c);
  SelectionManager::SelectionManager
            ((SelectionManager *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  psVar2 = (string *)(in_RDI + 0x55);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xff);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  in_RDI[0x1ab] = in_XMM0_Qa;
  *(undefined4 *)(in_RDI + 0x1ac) = in_R8D;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x130713);
  __a = (allocator<char> *)(in_RDI + 0x1b1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x130729);
  this_02 = (SelectionEvaluator *)(in_RDI + 0x1b4);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13073f);
  SelectionEvaluator::loadScriptString(this_04,psVar2);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x55));
  if (!(bool)uVar1) {
    in_stack_fffffffffffffd38 = in_RDI + 0x23;
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffd30,
               (SelectionSet *)in_stack_fffffffffffffd28);
    SelectionSet::~SelectionSet((SelectionSet *)0x1307c9);
  }
  in_RDI[0x1ad] = (double)in_RDI[0x1ab] / (double)*(int *)(in_RDI + 0x1ac);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffd40),
             (size_type)in_stack_fffffffffffffd38);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffd40),
             (size_type)in_stack_fffffffffffffd38);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffd40),
             (size_type)in_stack_fffffffffffffd38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)this_02,__a);
  StaticAnalyser::setAnalysisType(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  getPrefix((string *)in_stack_fffffffffffffd28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::stringstream::stringstream(local_248);
  this_00 = std::operator<<(local_238," len = ");
  this_01 = (StaticAnalyser *)std::ostream::operator<<(this_00,(double)in_RDI[0x1ab]);
  psVar2 = (string *)std::operator<<((ostream *)this_01,", nrbins = ");
  std::ostream::operator<<(psVar2,*(int *)(in_RDI + 0x1ac));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(this_01,psVar2);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::stringstream::~stringstream(local_248);
  return;
}

Assistant:

AngleR::AngleR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, RealType len, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      doVect_(true), doOffset_(false), selectionScript1_(sele1),
      seleMan1_(info), seleMan2_(info), evaluator1_(info), evaluator2_(info),
      len_(len), nRBins_(nrbins) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    deltaR_ = len_ / nRBins_;

    histogram_.resize(nRBins_);
    count_.resize(nRBins_);
    avgAngleR_.resize(nRBins_);

    setAnalysisType("radial density function Angle(r)");
    setOutputName(getPrefix(filename) + ".AngleR");
    std::stringstream params;
    params << " len = " << len_ << ", nrbins = " << nRBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }